

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrap.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Thread *this;
  int *piVar2;
  timespec local_28;
  
  this = (Thread *)operator_new(0x18);
  this->_vptr_Thread = (_func_int **)0x0;
  *(undefined8 *)&this->_stop = 0;
  (this->_thread)._M_id._M_thread = 0;
  this->_vptr_Thread = (_func_int **)&PTR__Thread_00103d48;
  Thread::start(this);
  local_28.tv_sec = 1;
  local_28.tv_nsec = 0;
  do {
    iVar1 = nanosleep(&local_28,&local_28);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  Thread::join(this);
  (*this->_vptr_Thread[1])(this);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Thread* t = new DerivedThread();
	t->start();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	t->join();
	delete t;

	return 0;
}